

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O0

void __thiscall fs_logger::debug(fs_logger *this,string *log_line)

{
  ostream *this_00;
  string *in_RSI;
  long in_RDI;
  
  this_00 = std::operator<<((ostream *)(in_RDI + 8),in_RSI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  return;
}

Assistant:

virtual void debug(const std::string& log_line)
    {
        fs_ << log_line << std::endl;
        fs_.flush();
    }